

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.h
# Opt level: O2

void __thiscall CheckStructure::CheckStructure(CheckStructure *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_10d;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109 [15];
  allocator_type local_fa;
  allocator local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (this->m_sMainType)._M_dataplus._M_p = (pointer)&(this->m_sMainType).field_2;
  (this->m_sMainType)._M_string_length = 0;
  (this->m_sMainType).field_2._M_local_buf[0] = '\0';
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_fWrongType = false;
  this->m_coutTypes = 0;
  this->m_countCalls = 0;
  std::__cxx11::string::string((string *)&local_f0,"double",local_109);
  std::__cxx11::string::string(local_d0,"int",&local_10a);
  std::__cxx11::string::string(local_b0,"void",&local_10b);
  std::__cxx11::string::string(local_90,"string",&local_10c);
  __l._M_len = 4;
  __l._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->types,__l,&local_10d);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  local_f8 = &this->types;
  std::__cxx11::string::string((string *)&this->nMain,"main",(allocator *)&local_f0);
  std::__cxx11::string::string((string *)&this->nReturn,"return",(allocator *)&local_f0);
  std::__cxx11::string::string((string *)&local_f0,"(",local_109);
  std::__cxx11::string::string(local_d0,")",&local_10a);
  std::__cxx11::string::string(local_b0,"{",&local_10b);
  std::__cxx11::string::string(local_90,";",&local_10c);
  std::__cxx11::string::string(local_70,"}",(allocator *)&local_10d);
  std::__cxx11::string::string(local_50,"()",&local_f9);
  __l_00._M_len = 6;
  __l_00._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->delimiters,__l_00,&local_fa);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

CheckStructure() : m_coutTypes(0), m_countCalls(0){}